

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# guarded_opt.hpp
# Opt level: O2

handle * __thiscall
gmlc::libguarded::guarded_opt<int,_std::timed_mutex>::try_lock
          (handle *__return_storage_ptr__,guarded_opt<int,_std::timed_mutex> *this)

{
  timed_mutex *in_RCX;
  unique_lock<std::timed_mutex> local_18;
  
  if (this->enabled == true) {
    try_lock_handle<int,std::timed_mutex>
              (__return_storage_ptr__,(libguarded *)this,(int *)&this->m_mutex,in_RCX);
  }
  else {
    __return_storage_ptr__->data = &this->m_obj;
    (__return_storage_ptr__->m_handle_lock)._M_device = (mutex_type *)0x0;
    (__return_storage_ptr__->m_handle_lock)._M_owns = false;
    local_18._M_device = (mutex_type *)0x0;
    local_18._M_owns = false;
    std::unique_lock<std::timed_mutex>::~unique_lock(&local_18);
  }
  return __return_storage_ptr__;
}

Assistant:

auto guarded_opt<T, M>::try_lock() -> handle
{
    return (enabled) ? try_lock_handle(&m_obj, m_mutex) :
                       handle(&m_obj, std::unique_lock<M>());
}